

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O2

char * Bbl_ManTruthToSop(uint *pTruth,int nVars)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  char *__size;
  
  if (0x10 < (uint)nVars) {
    __assert_fail("nVars >= 0 && nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                  ,0x4fd,"char *Bbl_ManTruthToSop(unsigned int *, int)");
  }
  uVar5 = 1 << ((byte)nVars & 0x1f);
  uVar6 = 0;
  for (uVar1 = 0; uVar5 != uVar1; uVar1 = uVar1 + 1) {
    uVar6 = uVar6 + ((pTruth[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0);
  }
  if (uVar6 == 0 || uVar6 == uVar5) {
    pcVar2 = (char *)malloc((ulong)(nVars + 4));
    for (lVar3 = 0; nVars != (int)lVar3; lVar3 = lVar3 + 1) {
      pcVar2[lVar3] = '-';
    }
    pcVar2[lVar3] = ' ';
    pcVar2[lVar3 + 1] = uVar6 == 0 ^ 0x31;
    (pcVar2 + lVar3 + 2)[0] = '\n';
    (pcVar2 + lVar3 + 2)[1] = '\0';
    if ((ulong)(nVars + 4) - 4 != lVar3) {
      __assert_fail("pTemp - pResult == nVars + 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                    ,0x50d,"char *Bbl_ManTruthToSop(unsigned int *, int)");
    }
  }
  else {
    __size = (char *)(long)(int)(uVar6 * (nVars + 3) + 1);
    pcVar2 = (char *)malloc((size_t)__size);
    pcVar4 = pcVar2;
    for (uVar1 = 0; uVar1 != uVar5; uVar1 = uVar1 + 1) {
      if ((pTruth[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0) {
        pcVar4 = pcVar4 + 3;
        for (uVar6 = 0; nVars != uVar6; uVar6 = uVar6 + 1) {
          pcVar4[-3] = (uVar1 >> (uVar6 & 0x1f) & 1) == 0 ^ 0x31;
          pcVar4 = pcVar4 + 1;
        }
        pcVar4[-3] = ' ';
        pcVar4[-2] = '1';
        pcVar4[-1] = '\n';
      }
    }
    *pcVar4 = '\0';
    if (pcVar4 + (1 - (long)pcVar2) != __size) {
      __assert_fail("pTemp - pResult == nOnes * (nVars + 3) + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                    ,0x51c,"char *Bbl_ManTruthToSop(unsigned int *, int)");
    }
  }
  return pcVar2;
}

Assistant:

char * Bbl_ManTruthToSop( unsigned * pTruth, int nVars )
{
    char * pResult, * pTemp;
    int nMints, nOnes, b, v;
    assert( nVars >= 0 && nVars <= 16 );
    nMints = (1 << nVars);
    // count the number of ones
    nOnes = 0;
    for ( b = 0; b < nMints; b++ )
        nOnes += ((pTruth[b>>5] >> (b&31)) & 1);
    // handle constants
    if ( nOnes == 0 || nOnes == nMints )
    {
        pResult = pTemp = BBLIF_ALLOC( char, nVars + 4 );        
        for ( v = 0; v < nVars; v++ )
            *pTemp++ = '-';
        *pTemp++ = ' ';
        *pTemp++ = nOnes? '1' : '0';
        *pTemp++ = '\n';
        *pTemp++ = 0;
        assert( pTemp - pResult == nVars + 4 );
        return pResult;
    }
    pResult = pTemp = BBLIF_ALLOC( char, nOnes * (nVars + 3) + 1 );        
    for ( b = 0; b < nMints; b++ )
    {
        if ( ((pTruth[b>>5] >> (b&31)) & 1) == 0 )
            continue;
        for ( v = 0; v < nVars; v++ )
            *pTemp++ = ((b >> v) & 1)? '1' : '0';
        *pTemp++ = ' ';
        *pTemp++ = '1';
        *pTemp++ = '\n';
    }
    *pTemp++ = 0;
    assert( pTemp - pResult == nOnes * (nVars + 3) + 1 );
    return pResult;
}